

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O0

void __thiscall
ConfidentialNonce_Constractor_hex33_Test::ConfidentialNonce_Constractor_hex33_Test
          (ConfidentialNonce_Constractor_hex33_Test *this)

{
  ConfidentialNonce_Constractor_hex33_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialNonce_Constractor_hex33_Test_00893820;
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_hex33) {
  // 33byte
  ConfidentialNonce nonce(
      "02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  EXPECT_STREQ(
      nonce.GetHex().c_str(),
      "02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 33);
  EXPECT_EQ(nonce.HasBlinding(), true);
}